

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O1

bool __thiscall
axl::sl::Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>::
setCountImpl<axl::sl::SimpleArrayDetails<wchar_t>::Construct>
          (Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_> *this,size_t count)

{
  int32_t *piVar1;
  ulong uVar2;
  Hdr *pHVar3;
  FreeFunc *pFVar4;
  BufHdr *pBVar5;
  size_t sVar6;
  EVP_PKEY_CTX *dst;
  Hdr *pHVar7;
  size_t size;
  bool bVar8;
  Ptr<axl::rc::BufHdr> hdr;
  Ptr<axl::rc::BufHdr> local_38;
  
  size = count * 4;
  pHVar7 = (this->super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>).m_hdr;
  if ((pHVar7 != (Hdr *)0x0) && ((pHVar7->super_RefCount).m_refCount == 1)) {
    bVar8 = true;
    if ((this->super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>).m_count == count) {
      return true;
    }
    if (size <= pHVar7->m_bufferSize) goto LAB_0011cbbd;
  }
  if (count == 0) {
    ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>::release
              (&this->super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>);
    return true;
  }
  if ((this->super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>).m_count != 0) {
    sVar6 = getAllocSize<4096ul>(size);
    dst = (EVP_PKEY_CTX *)operator_new(sVar6 + 0x28,(nothrow_t *)&std::nothrow);
    *(undefined4 *)(dst + 0x10) = 0;
    *(undefined4 *)(dst + 0x14) = 1;
    *(undefined ***)dst = &PTR__RefCount_0019ca28;
    *(size_t *)(dst + 0x18) = sVar6;
    *(undefined8 *)(dst + 0x20) = 0;
    *(code **)(dst + 8) = mem::deallocate;
    local_38.m_p = (Hdr *)0x0;
    local_38.m_refCount = (RefCount *)0x0;
    rc::Ptr<axl::rc::BufHdr>::copy(&local_38,dst,dst);
    bVar8 = local_38.m_p != (Hdr *)0x0;
    if (bVar8) {
      pHVar7 = local_38.m_p + 1;
      uVar2 = (this->super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>).m_count;
      if (uVar2 < count) {
        size = uVar2 * 4;
      }
      __wrap_memcpy(pHVar7,(this->super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>).m_p,size
                   );
      pHVar3 = (this->super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>).m_hdr;
      LOCK();
      piVar1 = &(pHVar3->super_RefCount).m_refCount;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        (**(pHVar3->super_RefCount)._vptr_RefCount)(pHVar3);
        LOCK();
        piVar1 = &(pHVar3->super_RefCount).m_weakRefCount;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if ((*piVar1 == 0) &&
           (pFVar4 = (pHVar3->super_RefCount).m_freeFunc, pFVar4 != (FreeFunc *)0x0)) {
          (*pFVar4)(pHVar3);
        }
      }
      pBVar5 = local_38.m_p;
      (this->super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>).m_p = (wchar_t *)pHVar7;
      local_38.m_p = (Hdr *)0x0;
      local_38.m_refCount = (RefCount *)0x0;
      (this->super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>).m_hdr = pBVar5;
      (this->super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>).m_count = count;
    }
    rc::Ptr<axl::rc::BufHdr>::clear(&local_38);
    return bVar8;
  }
  bVar8 = reserve(this,count);
  if (!bVar8) {
    return bVar8;
  }
LAB_0011cbbd:
  (this->super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>).m_count = count;
  return bVar8;
}

Assistant:

bool
	setCountImpl(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1) {
			if (this->m_count == count)
				return true;

			if (this->m_hdr->m_bufferSize >= size) {
				if (count > this->m_count)
					Construct() (this->m_p + this->m_count, count - this->m_count);
				else
					Details::destruct(this->m_p + count, this->m_count - count);

				Details::setHdrCount(this->m_hdr, count);
				this->m_count = count;
				return true;
			}
		}

		if (count == 0) {
			this->release();
			return true;
		}

		if (!this->m_count) {
			bool result = reserve(count);
			if (!result)
				return false;

			Construct() (this->m_p, count);
			Details::setHdrCount(this->m_hdr, count);
			this->m_count = count;
			return true;
		}

		ASSERT(this->m_hdr);

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, count);

		T* p = (T*)(hdr + 1);

		if (count <= this->m_count) {
			Details::constructCopy(p, this->m_p, count);
		} else {
			Details::constructCopy(p, this->m_p, this->m_count);
			Construct() (p + this->m_count, count - this->m_count);
		}

		this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		this->m_count = count;
		return true;
	}